

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall
HSimplexNla::reportPackValue(HSimplexNla *this,string *message,HVector *vector,bool force)

{
  HighsInt vecDim;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  vector<int,_std::allocator<int>_> sorted_index;
  string local_70;
  string local_50;
  
  if ((force | this->report_) == 1) {
    if (vector->packCount < 0x1a) {
      iVar2 = 0;
      printf("%s",(message->_M_dataplus)._M_p);
      std::vector<int,_std::allocator<int>_>::vector(&sorted_index,&vector->packIndex);
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                (sorted_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 sorted_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + vector->packCount);
      uVar3 = 0;
      while( true ) {
        if ((long)vector->packCount <= (long)uVar3) break;
        uVar1 = sorted_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        if ((int)((uVar3 & 0xffffffff) / 5) * 5 + iVar2 == 0) {
          putchar(10);
        }
        printf("[%4d %11.4g] ",
               (vector->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3],(ulong)uVar1);
        uVar3 = uVar3 + 1;
        iVar2 = iVar2 + -1;
      }
      putchar(10);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&sorted_index.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      std::__cxx11::string::string((string *)&local_50,(string *)message);
      vecDim = vector->packCount;
      std::__cxx11::string::string((string *)&local_70,"Unknown",(allocator *)&sorted_index);
      analyseVectorValues((HighsLogOptions *)0x0,&local_50,vecDim,&vector->packValue,true,&local_70)
      ;
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void HSimplexNla::reportPackValue(const std::string message,
                                  const HVector* vector,
                                  const bool force) const {
  if (!report_ && !force) return;
  if (vector->packCount > kReportItemLimit) {
    analyseVectorValues(nullptr, message, vector->packCount, vector->packValue,
                        true);
    return;
  }
  printf("%s", message.c_str());
  std::vector<HighsInt> sorted_index = vector->packIndex;
  pdqsort(sorted_index.begin(), sorted_index.begin() + vector->packCount);
  for (HighsInt en = 0; en < vector->packCount; en++) {
    HighsInt iRow = sorted_index[en];
    if (en % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)iRow, vector->packValue[en]);
  }
  printf("\n");
}